

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_generateSequences
                 (ZSTD_CCtx *zc,ZSTD_Sequence *outSeqs,size_t outSeqsSize,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  size_t dstCapacity_00;
  void *src_00;
  ZSTD_CCtx *in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *in_R8;
  SeqCollector seqCollector;
  void *dst;
  size_t dstCapacity;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  void *pvVar2;
  undefined8 local_8;
  
  dstCapacity_00 = ZSTD_compressBound((size_t)in_R8);
  customMem.customAlloc._4_4_ = in_stack_ffffffffffffffa4;
  customMem.customAlloc._0_4_ = in_stack_ffffffffffffffa0;
  customMem.customFree = (ZSTD_freeFunction)in_stack_ffffffffffffffa8;
  customMem.opaque = in_stack_ffffffffffffffb0;
  src_00 = ZSTD_customMalloc((size_t)(ZSTD_allocFunction)0x0,customMem);
  if (src_00 == (void *)0x0) {
    local_8 = 0xffffffffffffffc0;
  }
  else {
    uVar1 = 1;
    pvVar2 = (void *)0x0;
    *(ulong *)(in_RDI + 0x378) = CONCAT44(in_stack_ffffffffffffffa4,1);
    *(undefined8 *)(in_RDI + 0x380) = in_RSI;
    *(undefined8 *)(in_RDI + 0x388) = 0;
    *(size_t *)(in_RDI + 0x390) = in_RDX;
    ZSTD_compress2(in_RCX,in_R8,dstCapacity_00,src_00,in_RDX);
    customMem_00.customAlloc._4_4_ = in_stack_ffffffffffffffa4;
    customMem_00.customAlloc._0_4_ = uVar1;
    customMem_00.customFree = (ZSTD_freeFunction)in_RSI;
    customMem_00.opaque = pvVar2;
    ZSTD_customFree((ZSTD_freeFunction)0x0,customMem_00);
    local_8 = *(size_t *)(in_RDI + 0x388);
  }
  return local_8;
}

Assistant:

size_t ZSTD_generateSequences(ZSTD_CCtx* zc, ZSTD_Sequence* outSeqs,
                              size_t outSeqsSize, const void* src, size_t srcSize)
{
    const size_t dstCapacity = ZSTD_compressBound(srcSize);
    void* dst = ZSTD_customMalloc(dstCapacity, ZSTD_defaultCMem);
    SeqCollector seqCollector;

    RETURN_ERROR_IF(dst == NULL, memory_allocation, "NULL pointer!");

    seqCollector.collectSequences = 1;
    seqCollector.seqStart = outSeqs;
    seqCollector.seqIndex = 0;
    seqCollector.maxSequences = outSeqsSize;
    zc->seqCollector = seqCollector;

    ZSTD_compress2(zc, dst, dstCapacity, src, srcSize);
    ZSTD_customFree(dst, ZSTD_defaultCMem);
    return zc->seqCollector.seqIndex;
}